

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall
ArmParser::parseArmParameters
          (ArmParser *this,Parser *parser,tArmOpcode *opcode,ArmOpcodeVariables *vars)

{
  char cVar1;
  char symbol;
  bool bVar2;
  Token *pTVar3;
  char *pcVar4;
  undefined1 local_60 [7];
  bool optional;
  ArmRegisterValue tempRegister;
  char *encoding;
  ArmOpcodeVariables *vars_local;
  tArmOpcode *opcode_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  tempRegister._32_8_ = opcode->mask;
  ArmRegisterValue::ArmRegisterValue((ArmRegisterValue *)local_60);
  (vars->Shift).UseShift = false;
  (vars->Shift).UseFinal = false;
  vars->psr = false;
  vars->writeback = false;
  vars->SignPlus = false;
  (vars->Opcode).UseNewEncoding = false;
  (vars->Opcode).UseNewType = false;
  do {
    if (*(char *)tempRegister._32_8_ == '\0') {
      pTVar3 = Parser::nextToken(parser);
      this_local._7_1_ = pTVar3->type == Separator;
      goto LAB_001beaf5;
    }
    cVar1 = *(char *)tempRegister._32_8_;
    if (cVar1 == '/') {
      tempRegister._32_8_ = tempRegister._32_8_ + 1;
    }
    pcVar4 = (char *)(tempRegister._32_8_ + 1);
    switch(*(undefined1 *)tempRegister._32_8_) {
    case 0x44:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseCopRegister(this,parser,&(vars->CopData).cd);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    default:
      symbol = *(char *)tempRegister._32_8_;
      tempRegister._32_8_ = pcVar4;
      bVar2 = matchSymbol(this,parser,symbol,cVar1 == '/');
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x49:
    case 0x69:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseImmediate(this,parser,&vars->ImmediateExpression);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      vars->ImmediateBitLen = 0x20;
      break;
    case 0x4d:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseCopRegister(this,parser,&(vars->CopData).cm);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x4e:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseCopRegister(this,parser,&(vars->CopData).cn);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x50:
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      bVar2 = parsePsrTransfer(this,parser,vars,*pcVar4 == '1');
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x52:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseRegisterList(this,parser,&vars->rlist,0xffff);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x53:
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      bVar2 = parseShift(this,parser,vars,*pcVar4 == '1');
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x57:
      tempRegister._32_8_ = pcVar4;
      parseWriteback(this,parser,&vars->writeback);
      break;
    case 0x58:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseCopNumber(this,parser,&(vars->CopData).pn);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x59:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseImmediate(this,parser,&(vars->CopData).CpopExpression);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      vars->ImmediateBitLen = 4;
      break;
    case 0x5a:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseImmediate(this,parser,&(vars->CopData).CpinfExpression);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      vars->ImmediateBitLen = 3;
      break;
    case 100:
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      bVar2 = parseRegister(this,parser,&vars->rd,*pcVar4 == '1' ^ 0xf);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x6a:
      tempRegister._32_8_ = pcVar4;
      bVar2 = parseImmediate(this,parser,&vars->ImmediateExpression);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      vars->ImmediateBitLen = (int)*(char *)tempRegister._32_8_;
      tempRegister._32_8_ = tempRegister._32_8_ + 1;
      break;
    case 0x6d:
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      bVar2 = parseRegister(this,parser,&vars->rm,*pcVar4 == '1' ^ 0xf);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x6e:
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      bVar2 = parseRegister(this,parser,&vars->rn,*pcVar4 == '1' ^ 0xf);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x70:
      tempRegister._32_8_ = pcVar4;
      parsePsr(this,parser,&vars->psr);
      break;
    case 0x73:
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      bVar2 = parseRegister(this,parser,&vars->rs,*pcVar4 == '1' ^ 0xf);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001beaf5;
      }
      break;
    case 0x76:
      tempRegister._32_8_ = pcVar4;
      parseSign(this,parser,&vars->SignPlus);
      break;
    case 0x7a:
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      bVar2 = parsePseudoShift(this,parser,vars,(int)*pcVar4);
      if (!bVar2) {
        this_local._7_1_ = false;
LAB_001beaf5:
        ArmRegisterValue::~ArmRegisterValue((ArmRegisterValue *)local_60);
        return this_local._7_1_;
      }
    }
  } while( true );
}

Assistant:

bool ArmParser::parseArmParameters(Parser& parser, const tArmOpcode& opcode, ArmOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	
	vars.Shift.UseShift = false;
	vars.Shift.UseFinal = false;
	vars.psr = false;
	vars.writeback = false;
	vars.SignPlus = false;
	vars.Opcode.UseNewEncoding = false;
	vars.Opcode.UseNewType = false;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,*encoding++ == '1' ? 14 : 15));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,*encoding++ == '1' ? 14 : 15));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,*encoding++ == '1' ? 14 : 15));
			break;
		case 'm': // register
			CHECK(parseRegister(parser,vars.rm,*encoding++ == '1' ? 14 : 15));
			break;
		case 'D': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cd));
			break;
		case 'N': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cn));
			break;
		case 'M': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cm));
			break;
		case 'W':	// writeback
			parseWriteback(parser,vars.writeback);
			break;
		case 'p':	// psr
			parsePsr(parser,vars.psr);
			break;
		case 'P':	// msr/mrs psr data
			CHECK(parsePsrTransfer(parser,vars,*encoding++ == '1'));
			break;
		case 'R':	// register list
			CHECK(parseRegisterList(parser,vars.rlist,0xFFFF));
			break;
		case 'S':	// shift
			CHECK(parseShift(parser,vars,*encoding++ == '1'));
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = 32;
			break;
		case 'j':	// variable bit immediate
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		case 'X': // cop number
			CHECK(parseCopNumber(parser,vars.CopData.pn));
			break;
		case 'Y':	// cop opcode number
			CHECK(parseImmediate(parser,vars.CopData.CpopExpression));
			vars.ImmediateBitLen = 4;
			break;
		case 'Z':	// cop info number
			CHECK(parseImmediate(parser,vars.CopData.CpinfExpression));
			vars.ImmediateBitLen = 3;
			break;
		case 'z':	// shift for pseudo opcodes
			CHECK(parsePseudoShift(parser,vars,*encoding++));
			break;
		case 'v':	// sign for register index parameter
			parseSign(parser,vars.SignPlus);
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}